

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderStorageBufferObjectTests.cpp
# Opt level: O2

void __thiscall
gl4cts::anon_unknown_0::AdvancedUnsizedArrayLength2::AdvancedUnsizedArrayLength2
          (AdvancedUnsizedArrayLength2 *this)

{
  ShaderStorageBufferObjectBase::ShaderStorageBufferObjectBase
            (&this->super_ShaderStorageBufferObjectBase);
  (this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper =
       (_func_int **)&PTR__SubcaseBase_01dc93e8;
  this->m_program = 0;
  this->m_vertex_array = 0;
  this->stage = 2;
  this->etype = 0;
  this->layout = 1;
  this->other_members = false;
  this->bind_seq = 0;
  this->length_as_index = false;
  return;
}

Assistant:

AdvancedUnsizedArrayLength2()
		: m_program(0)
		, m_vertex_array(0)
		, stage(compute)
		, etype(vector)
		, layout(std430)
		, other_members(false)
		, bind_seq(bindbasebefore)
		, length_as_index(false)
	{
	}